

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Matcher::Print
          (Matcher *this,DebugWriter *w,Char *input,CharCount inputLength,CharCount inputOffset,
          uint8 *instPointer,ContStack *contStack,AssertionStack *assertionStack)

{
  Program *pPVar1;
  code *pcVar2;
  bool bVar3;
  Label LVar4;
  undefined4 *puVar5;
  uint *litbuf;
  Matcher *matcher;
  char16_t *form;
  int i;
  ulong uVar6;
  NopInst *actualInst;
  long lVar7;
  
  DebugWriter::PrintEOL(w,L"Matcher {");
  DebugWriter::Indent(w);
  DebugWriter::Print(w,L"program:      ");
  pPVar1 = (this->program).ptr;
  DebugWriter::PrintQuotedString(w,(pPVar1->source).ptr,pPVar1->sourceLen);
  DebugWriter::EOL(w);
  DebugWriter::Print(w,L"inputPointer: ");
  if (inputLength == 0) {
    form = L"<empty input>";
  }
  else {
    if (inputLength < 0x401) {
      DebugWriter::PrintEscapedString(w,input,inputOffset);
      if (inputOffset < inputLength) {
        DebugWriter::Print(w,L"<<<");
        DebugWriter::PrintEscapedChar(w,input[inputOffset]);
        DebugWriter::Print(w,L">>>");
        DebugWriter::PrintEscapedString(w,input + inputOffset + 1,~inputOffset + inputLength);
      }
      else {
        DebugWriter::Print(w,L"<<<>>>");
      }
      DebugWriter::EOL(w);
      goto LAB_00d40b52;
    }
    form = L"<string too large>";
  }
  DebugWriter::PrintEOL(w,form);
LAB_00d40b52:
  if (((this->program).ptr)->tag < BOIInstructionsForStickyFlagTag) {
    DebugWriter::Print(w,L"instPointer: ");
    litbuf = &switchD_00d40b8d::switchdataD_00ff0ed4;
    switch(*instPointer) {
    case '\0':
      LVar4 = InstPointerToLabel(this,instPointer);
      NopInst::Print((NopInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x01':
      LVar4 = InstPointerToLabel(this,instPointer);
      FailInst::Print((FailInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x02':
      LVar4 = InstPointerToLabel(this,instPointer);
      SuccInst::Print((SuccInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x03':
      LVar4 = InstPointerToLabel(this,instPointer);
      JumpInst::Print((JumpInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x04':
      LVar4 = InstPointerToLabel(this,instPointer);
      JumpIfNotCharInst::Print((JumpIfNotCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x05':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchCharOrJumpInst::Print((MatchCharOrJumpInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x06':
      LVar4 = InstPointerToLabel(this,instPointer);
      JumpIfNotSetInst::Print
                ((JumpIfNotSetInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\a':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchSetOrJumpInst::Print
                ((MatchSetOrJumpInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\b':
      LVar4 = InstPointerToLabel(this,instPointer);
      Switch2Inst::Print((Switch2Inst *)instPointer,w,LVar4,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\t':
      LVar4 = InstPointerToLabel(this,instPointer);
      Switch4Inst::Print((Switch4Inst *)instPointer,w,LVar4,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\n':
      LVar4 = InstPointerToLabel(this,instPointer);
      Switch8Inst::Print((Switch8Inst *)instPointer,w,LVar4,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\v':
      LVar4 = InstPointerToLabel(this,instPointer);
      Switch16Inst::Print((Switch16Inst *)instPointer,w,LVar4,
                          (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\f':
      LVar4 = InstPointerToLabel(this,instPointer);
      Switch24Inst::Print((Switch24Inst *)instPointer,w,LVar4,
                          (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\r':
      LVar4 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume2Inst::Print
                ((SwitchAndConsume2Inst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x0e':
      LVar4 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume4Inst::Print
                ((SwitchAndConsume4Inst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x0f':
      LVar4 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume8Inst::Print
                ((SwitchAndConsume8Inst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x10':
      LVar4 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume16Inst::Print
                ((SwitchAndConsume16Inst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x11':
      LVar4 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume24Inst::Print
                ((SwitchAndConsume24Inst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x12':
      LVar4 = InstPointerToLabel(this,instPointer);
      BOITestInst<true>::Print
                ((BOITestInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x13':
      LVar4 = InstPointerToLabel(this,instPointer);
      BOITestInst<false>::Print
                ((BOITestInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x14':
      LVar4 = InstPointerToLabel(this,instPointer);
      EOITestInst<true>::Print
                ((EOITestInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x15':
      LVar4 = InstPointerToLabel(this,instPointer);
      EOITestInst<false>::Print
                ((EOITestInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x16':
      LVar4 = InstPointerToLabel(this,instPointer);
      BOLTestInst::Print((BOLTestInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x17':
      LVar4 = InstPointerToLabel(this,instPointer);
      EOLTestInst::Print((EOLTestInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x18':
      LVar4 = InstPointerToLabel(this,instPointer);
      WordBoundaryTestInst<true>::Print
                ((WordBoundaryTestInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x19':
      LVar4 = InstPointerToLabel(this,instPointer);
      WordBoundaryTestInst<false>::Print
                ((WordBoundaryTestInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x1a':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchCharInst::Print((MatchCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x1b':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchChar2Inst::Print((MatchChar2Inst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x1c':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchChar3Inst::Print((MatchChar3Inst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x1d':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchChar4Inst::Print((MatchChar4Inst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\x1e':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchSetInst<false>::Print
                ((MatchSetInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x1f':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchSetInst<true>::Print
                ((MatchSetInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ' ':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchLiteralInst::Print
                ((MatchLiteralInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '!':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchLiteralEquivInst::Print
                ((MatchLiteralEquivInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\"':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchTrieInst::Print((MatchTrieInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '#':
      LVar4 = InstPointerToLabel(this,instPointer);
      OptMatchCharInst::Print((OptMatchCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '$':
      LVar4 = InstPointerToLabel(this,instPointer);
      OptMatchSetInst::Print
                ((OptMatchSetInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '%':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToCharAndContinueInst::Print
                ((SyncToCharAndContinueInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '&':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToChar2SetAndContinueInst::Print
                ((SyncToChar2SetAndContinueInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '\'':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndContinueInst<false>::Print
                ((SyncToSetAndContinueInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '(':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndContinueInst<true>::Print
                ((SyncToSetAndContinueInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ')':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                 instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '*':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '+':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ',':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer
                 ,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '-':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer
                 ,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '.':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToCharAndConsumeInst::Print
                ((SyncToCharAndConsumeInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '/':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToChar2SetAndConsumeInst::Print
                ((SyncToChar2SetAndConsumeInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '0':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndConsumeInst<false>::Print
                ((SyncToSetAndConsumeInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '1':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndConsumeInst<true>::Print
                ((SyncToSetAndConsumeInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '2':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer
                 ,w,LVar4,(Char *)litbuf);
      break;
    case '3':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '4':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '5':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,
                 w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '6':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,
                 w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '7':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToCharAndBackupInst::Print((SyncToCharAndBackupInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '8':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndBackupInst<false>::Print
                ((SyncToSetAndBackupInst<false> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '9':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToSetAndBackupInst<true>::Print
                ((SyncToSetAndBackupInst<true> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ':':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer,
                 w,LVar4,(Char *)litbuf);
      break;
    case ';':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '<':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '=':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,w
                 ,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '>':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,w
                 ,LVar4,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '?':
      LVar4 = InstPointerToLabel(this,instPointer);
      SyncToLiteralsAndBackupInst::Print
                ((SyncToLiteralsAndBackupInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '@':
      LVar4 = InstPointerToLabel(this,instPointer);
      MatchGroupInst::Print((MatchGroupInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'A':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginDefineGroupInst::Print((BeginDefineGroupInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'B':
      LVar4 = InstPointerToLabel(this,instPointer);
      EndDefineGroupInst::Print((EndDefineGroupInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'C':
      LVar4 = InstPointerToLabel(this,instPointer);
      DefineGroupFixedInst::Print((DefineGroupFixedInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'D':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginLoopInst::Print((BeginLoopInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'E':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatLoopInst::Print((RepeatLoopInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'F':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginLoopIfCharInst::Print((BeginLoopIfCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'G':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginLoopIfSetInst::Print
                ((BeginLoopIfSetInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'H':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatLoopIfCharInst::Print((RepeatLoopIfCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'I':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatLoopIfSetInst::Print((RepeatLoopIfSetInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'J':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginLoopFixedInst::Print((BeginLoopFixedInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'K':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatLoopFixedInst::Print((RepeatLoopFixedInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'L':
      LVar4 = InstPointerToLabel(this,instPointer);
      LoopSetInst::Print((LoopSetInst *)instPointer,w,LVar4,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'M':
      LVar4 = InstPointerToLabel(this,instPointer);
      LoopSetWithFollowFirstInst::Print
                ((LoopSetWithFollowFirstInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'N':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginLoopFixedGroupLastIterationInst::Print
                ((BeginLoopFixedGroupLastIterationInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'O':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatLoopFixedGroupLastIterationInst::Print
                ((RepeatLoopFixedGroupLastIterationInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'P':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginGreedyLoopNoBacktrackInst::Print
                ((BeginGreedyLoopNoBacktrackInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'Q':
      LVar4 = InstPointerToLabel(this,instPointer);
      RepeatGreedyLoopNoBacktrackInst::Print
                ((RepeatGreedyLoopNoBacktrackInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'R':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'S':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'T':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'U':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'V':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'W':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'X':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'Y':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'Z':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompCharBoundedInst::Print((ChompCharBoundedInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '[':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetBoundedInst::Print
                ((ChompSetBoundedInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\\':
      LVar4 = InstPointerToLabel(this,instPointer);
      ChompSetBoundedGroupLastCharInst::Print
                ((ChompSetBoundedGroupLastCharInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ']':
      LVar4 = InstPointerToLabel(this,instPointer);
      TryInst::Print((TryInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '^':
      LVar4 = InstPointerToLabel(this,instPointer);
      TryIfCharInst::Print((TryIfCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '_':
      LVar4 = InstPointerToLabel(this,instPointer);
      TryMatchCharInst::Print((TryMatchCharInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case '`':
      LVar4 = InstPointerToLabel(this,instPointer);
      TryIfSetInst::Print((TryIfSetInst *)instPointer,w,LVar4,
                          (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'a':
      LVar4 = InstPointerToLabel(this,instPointer);
      TryMatchSetInst::Print
                ((TryMatchSetInst *)instPointer,w,LVar4,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'b':
      LVar4 = InstPointerToLabel(this,instPointer);
      BeginAssertionInst::Print((BeginAssertionInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    case 'c':
      LVar4 = InstPointerToLabel(this,instPointer);
      EndAssertionInst::Print((EndAssertionInst *)instPointer,w,LVar4,(Char *)litbuf);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x15f1,"(false)","false");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    DebugWriter::PrintEOL(w,L"groups:");
    DebugWriter::Indent(w);
    lVar7 = 0;
    for (uVar6 = 0; uVar6 < ((this->program).ptr)->numGroups; uVar6 = uVar6 + 1) {
      DebugWriter::Print(w,L"%d: ",uVar6 & 0xffffffff);
      GroupInfo::Print((GroupInfo *)((long)&((this->groupInfos).ptr)->offset + lVar7),w,input);
      DebugWriter::EOL(w);
      lVar7 = lVar7 + 8;
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"loops:");
    DebugWriter::Indent(w);
    lVar7 = 0;
    for (uVar6 = 0; (long)uVar6 < (long)((this->program).ptr)->numLoops; uVar6 = uVar6 + 1) {
      DebugWriter::Print(w,L"%d: ",uVar6 & 0xffffffff);
      LoopInfo::Print((LoopInfo *)((long)&((this->loopInfos).ptr)->number + lVar7),w);
      DebugWriter::EOL(w);
      lVar7 = lVar7 + 0x10;
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"contStack: (top to bottom)");
    DebugWriter::Indent(w);
    ContStack::Print(contStack,w,input);
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"assertionStack: (top to bottom)");
    DebugWriter::Indent(w);
    AssertionStack::Print(assertionStack,w,matcher);
    DebugWriter::Unindent(w);
  }
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  DebugWriter::Flush(w);
  return;
}

Assistant:

void Matcher::Print(DebugWriter* w, const Char* const input, const CharCount inputLength, CharCount inputOffset, const uint8* instPointer, ContStack &contStack, AssertionStack &assertionStack) const
    {
        w->PrintEOL(_u("Matcher {"));
        w->Indent();
        w->Print(_u("program:      "));
        w->PrintQuotedString(program->source, program->sourceLen);
        w->EOL();
        w->Print(_u("inputPointer: "));
        if (inputLength == 0)
        {
            w->PrintEOL(_u("<empty input>"));
        }
        else if (inputLength > 1024)
        {
            w->PrintEOL(_u("<string too large>"));
        }
        else
        {
            w->PrintEscapedString(input, inputOffset);
            if (inputOffset >= inputLength)
            {
                w->Print(_u("<<<>>>"));
            }
            else
            {
                w->Print(_u("<<<"));
                w->PrintEscapedChar(input[inputOffset]);
                w->Print(_u(">>>"));
                w->PrintEscapedString(input + inputOffset + 1, inputLength - inputOffset - 1);
            }
            w->EOL();
        }
        if (program->tag == Program::ProgramTag::BOIInstructionsTag || program->tag == Program::ProgramTag::InstructionsTag)
        {
            w->Print(_u("instPointer: "));

            const Inst* inst = (const Inst*)instPointer;
            switch (inst->tag)
            {
#define MBase(TagName, ClassName) \
            case Inst::InstTag::TagName: \
            { \
                const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                actualInst->Print(w, InstPointerToLabel(instPointer), program->rep.insts.litbuf); \
                break; \
            }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
            default:
                Assert(false);
                __assume(false);
            }

            w->PrintEOL(_u("groups:"));
            w->Indent();
            for (int i = 0; i < program->numGroups; i++)
            {
                w->Print(_u("%d: "), i);
                groupInfos[i].Print(w, input);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("loops:"));
            w->Indent();
            for (int i = 0; i < program->numLoops; i++)
            {
                w->Print(_u("%d: "), i);
                loopInfos[i].Print(w);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("contStack: (top to bottom)"));
            w->Indent();
            contStack.Print(w, input);
            w->Unindent();
            w->PrintEOL(_u("assertionStack: (top to bottom)"));
            w->Indent();
            assertionStack.Print(w, this);
            w->Unindent();
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
        w->Flush();
    }